

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

stumpless_target * stumpless_open_stream_target(char *name,FILE *stream)

{
  stumpless_target *target_00;
  stream_target *psVar1;
  ushort local_2a;
  unsigned_short i;
  stumpless_target *target;
  FILE *stream_local;
  char *name_local;
  
  clear_error();
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else if (stream == (FILE *)0x0) {
    raise_argument_empty("stream was NULL");
  }
  else {
    target_00 = new_target(STUMPLESS_STREAM_TARGET,name);
    if (target_00 != (stumpless_target *)0x0) {
      psVar1 = new_stream_target(stream);
      target_00->id = psVar1;
      if (target_00->id != (stumpless_id_t)0x0) {
        for (local_2a = 0; local_2a < 8; local_2a = local_2a + 1) {
          *(undefined1 *)((long)target_00->id + (ulong)local_2a * 0x20 + 8) = 0;
        }
        stumpless_set_current_target(target_00);
        return target_00;
      }
      destroy_target(target_00);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_stream_target( const char *name, FILE *stream ) {
  struct stumpless_target *target;

  clear_error(  );

  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( stream );

  target = new_target( STUMPLESS_STREAM_TARGET, name );

  if( !target ) {
    goto fail;
  }

  target->id = new_stream_target( stream );
  if( !target->id ) {
    goto fail_id;
  }

  for (unsigned short i = 0; i < 8; i++)
    ((struct stream_target *)(target->id))->escape_codes[i][0] = 0;

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}